

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O2

_Bool plane_ray3_intersection(plane_t p,ray3_t r,vec3_t *out)

{
  float fVar1;
  
  fVar1 = -(p.c * r.start.z + p.a * r.start.x + r.start.y * p.b + p.d) /
          (p.c * r.direction.z + p.a * r.direction.x + r.direction.y * p.b);
  if (0.0 <= fVar1) {
    out->x = r.start.x + r.direction.x * fVar1;
    out->y = r.start.y + r.direction.y * fVar1;
    out->z = r.start.z + r.direction.z * fVar1;
  }
  return 0.0 <= fVar1;
}

Assistant:

bool
plane_ray3_intersection(plane_t p, ray3_t r, vec3_t* out) {
    vec3_t	n	= plane_normal(p);
    float	t	=  -(p.d + vec3_dot(n, r.start)) / vec3_dot(n, r.direction);
    if( t < 0.0f )
        return false;
    *out	= vec3_add(r.start,
               vec3_mulf(r.direction,
                     t));
    return true;
}